

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

string * __thiscall
Assimp::FBX::FBXConverter::MakeUniqueNodeName_abi_cxx11_
          (string *__return_storage_ptr__,FBXConverter *this,Model *model,aiNode *parent)

{
  ulong uVar1;
  char *pcVar2;
  string original_name;
  string local_60;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  FixNodeName(&local_60,this,&(model->super_Object).name);
  if (local_60._M_string_length == 0) {
    pcVar2 = (char *)0x0;
    uVar1 = 0;
    do {
      if (uVar1 != 0 && pcVar2 != (char *)0x0) break;
      pcVar2 = (parent->mName).data;
      uVar1 = (ulong)(parent->mName).length;
      parent = parent->mParent;
    } while (parent != (aiNode *)0x0);
    local_40 = &local_30;
    if (uVar1 == 0 || pcVar2 == (char *)0x0) {
      local_38 = 0;
      local_30 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar2,pcVar2 + uVar1);
    }
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
    if (local_40 != &local_30) {
      operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  GetUniqueName(this,&local_60,__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FBXConverter::MakeUniqueNodeName(const Model* const model, const aiNode& parent)
        {
            std::string original_name = FixNodeName(model->Name());
            if (original_name.empty())
            {
                original_name = getAncestorBaseName(&parent);
            }
            std::string unique_name;
            GetUniqueName(original_name, unique_name);
            return unique_name;
        }